

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void __thiscall
CharConvUTF8::unpack(CharConvUTF8 *this,vm_val_t *val,CVmDataSource *src,int cnt,char pad)

{
  undefined4 uVar1;
  undefined4 uVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  int iVar6;
  wchar_t wVar7;
  CVmObjPageEntry *this_00;
  size_t byte_size;
  utf8_ptr p;
  size_t rem;
  
  byte_size = (size_t)cnt;
  vVar5 = CVmObjString::create(0,byte_size);
  val->typ = VM_OBJ;
  (val->val).obj = vVar5;
  pvVar4 = sp_;
  this_00 = G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff);
  uVar1 = *(undefined4 *)&val->field_0x4;
  vVar5 = (val->val).obj;
  uVar2 = *(undefined4 *)((long)&val->val + 4);
  pvVar3 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar3 = val->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar1;
  (pvVar4->val).obj = vVar5;
  *(undefined4 *)((long)&pvVar4->val + 4) = uVar2;
  if (cnt != 0) {
    iVar6 = (*src->_vptr_CVmDataSource[2])(src,*(long *)((long)&this_00->ptr_ + 8) + 2,byte_size);
    if (iVar6 != 0) {
      err_throw(0x65);
    }
    CCharmapToUni::validate((char *)(*(long *)((long)&this_00->ptr_ + 8) + 2),byte_size);
    p.p_ = (char *)(*(long *)((long)&this_00->ptr_ + 8) + byte_size + 2);
    rem = 0;
    do {
      if (cnt <= (int)rem) goto LAB_0029c127;
      utf8_ptr::dec(&p,&rem);
      wVar7 = utf8_ptr::s_getch(p.p_);
    } while (wVar7 == pad);
    utf8_ptr::inc(&p,&rem);
LAB_0029c127:
    CVmObjString::cons_shrink_buffer((CVmObjString *)this_00,p.p_);
  }
  sp_ = sp_ + -1;
  return;
}

Assistant:

virtual void unpack(VMG_ vm_val_t *val, CVmDataSource *src, int cnt,
                        char pad)
    {
        /*
         *   For UTF-8, we can simply read the bytes directly into a string
         *   buffer.  Allocate the string at the required byte size, and push
         *   for gc protection.  
         */
        val->set_obj(CVmObjString::create(vmg_ FALSE, cnt));
        CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);
        G_stk->push(val);

        /* if the read count is non-zero, read the data */
        if (cnt != 0)
        {
            /* read the data directly into the string buffer */
            if (src->read(str->cons_get_buf(), cnt))
                err_throw(VMERR_READ_FILE);

            /* validate the UTF-8 */
            CCharmapToUni::validate(str->cons_get_buf(), cnt);

            /* remove trailing padding */
            utf8_ptr p(str->cons_get_buf() + cnt);
            for (size_t rem = 0 ; (int)rem < cnt ; )
            {
                /* 
                 *   move to the previous character; if it's not the padding
                 *   character, we're done 
                 */
                p.dec(&rem);
                if (p.getch() != pad)
                {
                    p.inc(&rem);
                    break;
                }
            }

            /* set the string length to the length without the padding */
            str->cons_shrink_buffer(vmg_ p.getptr());
        }

        /* done with the gc protection */
        G_stk->discard();
    }